

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_genprime.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  ulong uVar4;
  char *pcVar5;
  size_t nbits;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi G;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_mpi mStack_5d8;
  mbedtls_mpi local_5c0;
  mbedtls_mpi local_5a8;
  mbedtls_ctr_drbg_context local_590;
  mbedtls_entropy_context local_438;
  
  mbedtls_mpi_init(&local_5a8);
  mbedtls_mpi_init(&local_5c0);
  mbedtls_mpi_init(&mStack_5d8);
  mbedtls_ctr_drbg_init(&local_590);
  mbedtls_entropy_init(&local_438);
  if (argc == 0) {
LAB_001033c2:
    printf(
          "\n usage: dh_genprime param=<>...\n\n acceprable parameters:\n    bits=%%d           default: 2048\n"
          );
    return 1;
  }
  nbits = 0x800;
  if (1 < argc) {
    uVar4 = 1;
    do {
      pcVar5 = argv[uVar4];
      pcVar3 = strchr(pcVar5,0x3d);
      if (pcVar3 == (char *)0x0) goto LAB_001033c2;
      *pcVar3 = '\0';
      iVar1 = strcmp(pcVar5,"bits");
      if ((iVar1 != 0) || (uVar2 = atoi(pcVar3 + 1), 0x2000 < uVar2)) goto LAB_001033c2;
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
    nbits = (size_t)uVar2;
  }
  uVar2 = mbedtls_mpi_read_string(&local_5a8,10,"4");
  if (uVar2 == 0) {
    puts("  ! Generating large primes may take minutes!");
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    uVar2 = mbedtls_ctr_drbg_seed
                      (&local_590,mbedtls_entropy_func,&local_438,(uchar *)"dh_genprime",0xb);
    if (uVar2 == 0) {
      printf(" ok\n  . Generating the modulus, please wait...");
      fflush(_stdout);
      iVar1 = 1;
      uVar2 = mbedtls_mpi_gen_prime(&local_5c0,nbits,1,mbedtls_ctr_drbg_random,&local_590);
      if (uVar2 == 0) {
        printf(" ok\n  . Verifying that Q = (P-1)/2 is prime...");
        fflush(_stdout);
        uVar2 = mbedtls_mpi_sub_int(&mStack_5d8,&local_5c0,1);
        if (uVar2 == 0) {
          uVar2 = mbedtls_mpi_div_int(&mStack_5d8,(mbedtls_mpi *)0x0,&mStack_5d8,2);
          if (uVar2 == 0) {
            uVar2 = mbedtls_mpi_is_prime_ext(&mStack_5d8,0x32,mbedtls_ctr_drbg_random,&local_590);
            if (uVar2 == 0) {
              printf(" ok\n  . Exporting the value in dh_prime.txt...");
              fflush(_stdout);
              __stream = fopen("dh_prime.txt","wb+");
              if (__stream == (FILE *)0x0) {
                puts(" failed\n  ! Could not create dh_prime.txt\n");
              }
              else {
                iVar1 = mbedtls_mpi_write_file("P = ",&local_5c0,0x10,(FILE *)__stream);
                if ((iVar1 == 0) &&
                   (iVar1 = mbedtls_mpi_write_file("G = ",&local_5a8,0x10,(FILE *)__stream),
                   iVar1 == 0)) {
                  puts(" ok\n");
                  fclose(__stream);
                  iVar1 = 0;
                }
                else {
                  iVar1 = 1;
                  printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",1);
                  fclose(__stream);
                }
              }
              goto LAB_00103442;
            }
            pcVar5 = " failed\n  ! mbedtls_mpi_is_prime returned %d\n\n";
          }
          else {
            pcVar5 = " failed\n  ! mbedtls_mpi_div_int returned %d\n\n";
          }
        }
        else {
          pcVar5 = " failed\n  ! mbedtls_mpi_sub_int returned %d\n\n";
        }
      }
      else {
        pcVar5 = " failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n";
      }
      printf(pcVar5,(ulong)uVar2);
      goto LAB_00103442;
    }
    pcVar5 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
  }
  else {
    pcVar5 = " failed\n  ! mbedtls_mpi_read_string returned %d\n";
  }
  printf(pcVar5,(ulong)uVar2);
  iVar1 = 1;
LAB_00103442:
  mbedtls_mpi_free(&local_5a8);
  mbedtls_mpi_free(&local_5c0);
  mbedtls_mpi_free(&mStack_5d8);
  mbedtls_ctr_drbg_free(&local_590);
  mbedtls_entropy_free(&local_438);
  return iVar1;
}

Assistant:

int main( int argc, char **argv )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_mpi G, P, Q;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "dh_genprime";
    FILE *fout;
    int nbits = DFL_BITS;
    int i;
    char *p, *q;

    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        return( exit_code );
    }

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "bits" ) == 0 )
        {
            nbits = atoi( q );
            if( nbits < 0 || nbits > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
        else
            goto usage;
    }

    if( ( ret = mbedtls_mpi_read_string( &G, 10, GENERATOR ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_string returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( "  ! Generating large primes may take minutes!\n" );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the modulus, please wait..." );
    fflush( stdout );

    /*
     * This can take a long time...
     */
    if( ( ret = mbedtls_mpi_gen_prime( &P, nbits, 1,
                               mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Verifying that Q = (P-1)/2 is prime..." );
    fflush( stdout );

    if( ( ret = mbedtls_mpi_sub_int( &Q, &P, 1 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_sub_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_div_int( &Q, NULL, &Q, 2 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_div_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_is_prime_ext( &Q, 50, mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_is_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the value in dh_prime.txt..." );
    fflush( stdout );

    if( ( fout = fopen( "dh_prime.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not create dh_prime.txt\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "P = ", &P, 16, fout ) != 0 ) ||
        ( ret = mbedtls_mpi_write_file( "G = ", &G, 16, fout ) != 0 ) )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        fclose( fout );
        goto exit;
    }

    mbedtls_printf( " ok\n\n" );
    fclose( fout );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}